

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

collision_shape_ptr __thiscall APhyBullet::BulletEngine::createCompoundShape(BulletEngine *this)

{
  ref<aphy::collision_shape> rVar1;
  collision_shape_ptr in_RAX;
  btCompoundShape *this_00;
  ref<aphy::collision_shape> local_18;
  
  local_18.counter = in_RAX;
  this_00 = (btCompoundShape *)btCompoundShape::operator_new(0x80);
  btCompoundShape::btCompoundShape(this_00,true,0);
  aphy::
  makeObjectWithInterface<aphy::collision_shape,APhyBullet::BulletCollisionShape,btCompoundShape*,APhyBullet::APhyBulletCollisionShapeType>
            ((aphy *)&local_18,this_00,Compound);
  rVar1.counter = local_18.counter;
  local_18.counter = (Counter *)0x0;
  aphy::ref<aphy::collision_shape>::~ref(&local_18);
  return rVar1.counter;
}

Assistant:

collision_shape_ptr BulletEngine::createCompoundShape()
{
    return makeObject<BulletCollisionShape> (
        new btCompoundShape(),
        APhyBulletCollisionShapeType::Compound
    ).disown();
}